

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

void __thiscall llvm::Obj2YamlError::~Obj2YamlError(Obj2YamlError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__Obj2YamlError_00d8dbd0;
  pcVar2 = (this->ErrMsg)._M_dataplus._M_p;
  paVar1 = &(this->ErrMsg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

Obj2YamlError(obj2yaml_error C) : Code(C) {}